

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

char * spvGeneratorStr(uint32_t generator)

{
  VendorTool *pVVar1;
  VendorTool *pVVar2;
  VendorTool *where;
  char *pcStack_10;
  uint32_t generator_local;
  
  pVVar1 = std::begin<(anonymous_namespace)::VendorTool_const,45ul>
                     ((VendorTool (*) [45])(anonymous_namespace)::vendor_tools);
  pVVar2 = std::end<(anonymous_namespace)::VendorTool_const,45ul>
                     ((VendorTool (*) [45])(anonymous_namespace)::vendor_tools);
  pVVar1 = std::find_if<(anonymous_namespace)::VendorTool_const*,spvGeneratorStr(unsigned_int)::__0>
                     (pVVar1,pVVar2,(anon_class_4_1_26b32173_for__M_pred)generator);
  pVVar2 = std::end<(anonymous_namespace)::VendorTool_const,45ul>
                     ((VendorTool (*) [45])(anonymous_namespace)::vendor_tools);
  if (pVVar1 == pVVar2) {
    pcStack_10 = "Unknown";
  }
  else {
    pcStack_10 = pVVar1->vendor_tool;
  }
  return pcStack_10;
}

Assistant:

const char* spvGeneratorStr(uint32_t generator) {
  auto where = std::find_if(
      std::begin(vendor_tools), std::end(vendor_tools),
      [generator](const VendorTool& vt) { return generator == vt.value; });
  if (where != std::end(vendor_tools)) return where->vendor_tool;
  return "Unknown";
}